

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<unsigned_long,std::allocator<unsigned_long>>,void>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *container,ostream *os)

{
  bool bVar1;
  reference value;
  unsigned_long *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(container);
  elem = (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(container)
  ;
  do {
    bVar1 = __gnu_cxx::
            operator==<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      (&__end0,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&elem);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_001154b7:
      if (__range3 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = __gnu_cxx::
            __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator*(&__end0);
    if ((__range3 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) &&
       (std::operator<<(os,','),
       __range3 == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_001154b7;
    }
    std::operator<<(os,' ');
    UniversalPrint<unsigned_long>(value,os);
    __range3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(__range3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }